

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx::ArrayIntersectorK_1<8,_embree::avx::QuadMiIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float **ppfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined4 uVar63;
  undefined1 auVar64 [32];
  undefined4 uVar65;
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  bool bVar79;
  bool bVar80;
  bool bVar81;
  bool bVar82;
  bool bVar83;
  bool bVar84;
  bool bVar85;
  bool bVar86;
  long lVar87;
  ulong uVar88;
  long lVar89;
  uint uVar90;
  ulong uVar91;
  ulong uVar92;
  ulong uVar93;
  ulong uVar94;
  ulong *puVar95;
  ulong *puVar96;
  Scene *pSVar97;
  ulong uVar98;
  undefined1 auVar99 [8];
  ulong uVar100;
  ulong uVar101;
  ulong uVar102;
  ulong unaff_R15;
  size_t mask;
  bool bVar103;
  bool bVar104;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar117;
  undefined1 auVar108 [16];
  float fVar105;
  float fVar115;
  float fVar116;
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  vint4 bi;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  vint4 ai;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  undefined1 auVar135 [32];
  undefined1 auVar136 [64];
  float fVar139;
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  float fVar141;
  undefined1 auVar140 [32];
  float fVar142;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  undefined1 auVar143 [32];
  float fVar153;
  undefined1 auVar154 [32];
  float fVar156;
  uint uVar157;
  float fVar158;
  uint uVar159;
  float fVar160;
  uint uVar161;
  float fVar162;
  uint uVar163;
  float fVar164;
  uint uVar165;
  float fVar166;
  uint uVar167;
  uint uVar168;
  undefined1 auVar155 [64];
  float fVar169;
  undefined1 auVar170 [32];
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar171 [64];
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 local_cd0;
  undefined8 uStack_cc8;
  undefined1 local_cc0 [32];
  RTCFilterFunctionNArguments local_c90;
  undefined1 local_c60 [32];
  undefined1 local_c40 [8];
  float fStack_c38;
  float fStack_c34;
  float fStack_c30;
  float fStack_c2c;
  float fStack_c28;
  undefined4 uStack_c24;
  undefined1 local_c20 [32];
  undefined1 local_c00 [16];
  undefined1 local_bf0 [16];
  float local_be0;
  float fStack_bdc;
  float fStack_bd8;
  float fStack_bd4;
  float local_bd0;
  float fStack_bcc;
  float fStack_bc8;
  float fStack_bc4;
  float local_bc0;
  float fStack_bbc;
  float fStack_bb8;
  float fStack_bb4;
  undefined1 local_bb0 [16];
  undefined1 local_ba0 [16];
  undefined1 local_b90 [16];
  undefined1 local_b80 [8];
  float fStack_b78;
  float fStack_b74;
  float fStack_b70;
  float fStack_b6c;
  float fStack_b68;
  undefined4 uStack_b64;
  undefined1 local_b60 [32];
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  float local_a60;
  float fStack_a5c;
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  undefined4 uStack_a44;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  float local_9c0 [4];
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  float local_9a0 [4];
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  undefined4 uStack_984;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  RTCHitN local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [16];
  undefined1 local_850 [16];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_800 = root.ptr;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_b90._4_4_ = uVar1;
  local_b90._0_4_ = uVar1;
  local_b90._8_4_ = uVar1;
  local_b90._12_4_ = uVar1;
  auVar133 = ZEXT1664(local_b90);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_ba0._4_4_ = uVar1;
  local_ba0._0_4_ = uVar1;
  local_ba0._8_4_ = uVar1;
  local_ba0._12_4_ = uVar1;
  auVar134 = ZEXT1664(local_ba0);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_bb0._4_4_ = uVar1;
  local_bb0._0_4_ = uVar1;
  local_bb0._8_4_ = uVar1;
  local_bb0._12_4_ = uVar1;
  auVar136 = ZEXT1664(local_bb0);
  fVar105 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar115 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar116 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  uVar98 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  auVar99 = (undefined1  [8])(long)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar94 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar100 = uVar98 ^ 0x10;
  uVar92 = (ulong)auVar99 ^ 0x10;
  iVar2 = (tray->tnear).field_0.i[k];
  local_bf0._4_4_ = iVar2;
  local_bf0._0_4_ = iVar2;
  local_bf0._8_4_ = iVar2;
  local_bf0._12_4_ = iVar2;
  auVar155 = ZEXT1664(local_bf0);
  iVar2 = (tray->tfar).field_0.i[k];
  local_c00._4_4_ = iVar2;
  local_c00._0_4_ = iVar2;
  local_c00._8_4_ = iVar2;
  local_c00._12_4_ = iVar2;
  auVar171 = ZEXT1664(local_c00);
  local_b60._16_16_ = mm_lookupmask_ps._240_16_;
  local_b60._0_16_ = mm_lookupmask_ps._0_16_;
  uVar90 = 1 << ((byte)k & 0x1f);
  uVar88 = (ulong)((uVar90 & 0xf) << 4);
  lVar89 = (long)((int)uVar90 >> 4) * 0x10;
  auVar128._8_4_ = 0x3f800000;
  auVar128._0_8_ = &DAT_3f8000003f800000;
  auVar128._12_4_ = 0x3f800000;
  auVar128._16_4_ = 0x3f800000;
  auVar128._20_4_ = 0x3f800000;
  auVar128._24_4_ = 0x3f800000;
  auVar128._28_4_ = 0x3f800000;
  auVar109._8_4_ = 0xbf800000;
  auVar109._0_8_ = 0xbf800000bf800000;
  auVar109._12_4_ = 0xbf800000;
  auVar109._16_4_ = 0xbf800000;
  auVar109._20_4_ = 0xbf800000;
  auVar109._24_4_ = 0xbf800000;
  auVar109._28_4_ = 0xbf800000;
  _local_b80 = vblendvps_avx(auVar128,auVar109,local_b60);
  puVar96 = local_7f8;
  fVar117 = fVar105;
  fVar118 = fVar105;
  fVar119 = fVar105;
  fVar120 = fVar115;
  fVar139 = fVar115;
  fVar141 = fVar115;
  fVar144 = fVar116;
  fVar146 = fVar116;
  fVar148 = fVar116;
  local_be0 = fVar116;
  fStack_bdc = fVar116;
  fStack_bd8 = fVar116;
  fStack_bd4 = fVar116;
  local_bd0 = fVar115;
  fStack_bcc = fVar115;
  fStack_bc8 = fVar115;
  fStack_bc4 = fVar115;
  local_bc0 = fVar105;
  fStack_bbc = fVar105;
  fStack_bb8 = fVar105;
  fStack_bb4 = fVar105;
  do {
    puVar95 = puVar96;
    if (puVar95 == &local_800) break;
    puVar96 = puVar95 + -1;
    uVar102 = puVar95[-1];
    do {
      if ((uVar102 & 8) == 0) {
        auVar108 = vsubps_avx(*(undefined1 (*) [16])(uVar102 + 0x20 + uVar98),auVar133._0_16_);
        auVar106._0_4_ = fVar105 * auVar108._0_4_;
        auVar106._4_4_ = fVar117 * auVar108._4_4_;
        auVar106._8_4_ = fVar118 * auVar108._8_4_;
        auVar106._12_4_ = fVar119 * auVar108._12_4_;
        auVar108 = vsubps_avx(*(undefined1 (*) [16])(uVar102 + 0x20 + (long)auVar99),auVar134._0_16_
                             );
        auVar107._0_4_ = fVar115 * auVar108._0_4_;
        auVar107._4_4_ = fVar120 * auVar108._4_4_;
        auVar107._8_4_ = fVar139 * auVar108._8_4_;
        auVar107._12_4_ = fVar141 * auVar108._12_4_;
        auVar108 = vpmaxsd_avx(auVar106,auVar107);
        auVar106 = vsubps_avx(*(undefined1 (*) [16])(uVar102 + 0x20 + uVar94),auVar136._0_16_);
        auVar121._0_4_ = fVar116 * auVar106._0_4_;
        auVar121._4_4_ = fVar144 * auVar106._4_4_;
        auVar121._8_4_ = fVar146 * auVar106._8_4_;
        auVar121._12_4_ = fVar148 * auVar106._12_4_;
        auVar106 = vpmaxsd_avx(auVar121,auVar155._0_16_);
        auVar108 = vpmaxsd_avx(auVar108,auVar106);
        auVar106 = vsubps_avx(*(undefined1 (*) [16])(uVar102 + 0x20 + uVar100),auVar133._0_16_);
        auVar122._0_4_ = fVar105 * auVar106._0_4_;
        auVar122._4_4_ = fVar117 * auVar106._4_4_;
        auVar122._8_4_ = fVar118 * auVar106._8_4_;
        auVar122._12_4_ = fVar119 * auVar106._12_4_;
        auVar106 = vsubps_avx(*(undefined1 (*) [16])(uVar102 + 0x20 + uVar92),auVar134._0_16_);
        auVar126._0_4_ = fVar115 * auVar106._0_4_;
        auVar126._4_4_ = fVar120 * auVar106._4_4_;
        auVar126._8_4_ = fVar139 * auVar106._8_4_;
        auVar126._12_4_ = fVar141 * auVar106._12_4_;
        auVar106 = vpminsd_avx(auVar122,auVar126);
        auVar107 = vsubps_avx(*(undefined1 (*) [16])(uVar102 + 0x20 + (uVar94 ^ 0x10)),
                              auVar136._0_16_);
        auVar127._0_4_ = fVar116 * auVar107._0_4_;
        auVar127._4_4_ = fVar144 * auVar107._4_4_;
        auVar127._8_4_ = fVar146 * auVar107._8_4_;
        auVar127._12_4_ = fVar148 * auVar107._12_4_;
        auVar107 = vpminsd_avx(auVar127,auVar171._0_16_);
        auVar106 = vpminsd_avx(auVar106,auVar107);
        auVar108 = vpcmpgtd_avx(auVar108,auVar106);
        uVar90 = vmovmskps_avx(auVar108);
        unaff_R15 = ((ulong)uVar90 ^ 0xf) & 0xff;
      }
      if ((uVar102 & 8) == 0) {
        if (unaff_R15 == 0) {
          uVar90 = 4;
        }
        else {
          uVar101 = uVar102 & 0xfffffffffffffff0;
          lVar87 = 0;
          if (unaff_R15 != 0) {
            for (; (unaff_R15 >> lVar87 & 1) == 0; lVar87 = lVar87 + 1) {
            }
          }
          uVar90 = 0;
          uVar102 = *(ulong *)(uVar101 + lVar87 * 8);
          uVar93 = unaff_R15 - 1 & unaff_R15;
          if (uVar93 != 0) {
            *puVar96 = uVar102;
            lVar87 = 0;
            if (uVar93 != 0) {
              for (; (uVar93 >> lVar87 & 1) == 0; lVar87 = lVar87 + 1) {
              }
            }
            uVar91 = uVar93 - 1;
            while( true ) {
              puVar96 = puVar96 + 1;
              uVar102 = *(ulong *)(uVar101 + lVar87 * 8);
              uVar91 = uVar91 & uVar93;
              if (uVar91 == 0) break;
              *puVar96 = uVar102;
              lVar87 = 0;
              if (uVar91 != 0) {
                for (; (uVar91 >> lVar87 & 1) == 0; lVar87 = lVar87 + 1) {
                }
              }
              uVar93 = uVar91 - 1;
            }
          }
        }
      }
      else {
        uVar90 = 6;
      }
    } while (uVar90 == 0);
    if (uVar90 == 6) {
      uVar101 = (ulong)((uint)uVar102 & 0xf);
      uVar93 = uVar101 - 8;
      bVar103 = uVar101 != 8;
      if (bVar103) {
        uVar102 = uVar102 & 0xfffffffffffffff0;
        uVar101 = 0;
        do {
          lVar87 = uVar101 * 0x60;
          pSVar97 = context->scene;
          ppfVar5 = (pSVar97->vertices).items;
          pfVar6 = ppfVar5[*(uint *)(uVar102 + 0x40 + lVar87)];
          pfVar7 = ppfVar5[*(uint *)(uVar102 + 0x44 + lVar87)];
          pfVar8 = ppfVar5[*(uint *)(uVar102 + 0x48 + lVar87)];
          pfVar9 = ppfVar5[*(uint *)(uVar102 + 0x4c + lVar87)];
          auVar107 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar102 + lVar87)),
                                   *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar102 + 8 + lVar87)))
          ;
          auVar108 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar102 + lVar87)),
                                   *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar102 + 8 + lVar87)))
          ;
          auVar121 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar102 + 4 + lVar87)),
                                   *(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar102 + 0xc + lVar87)));
          auVar106 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar102 + 4 + lVar87)),
                                   *(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar102 + 0xc + lVar87)));
          auVar126 = vunpcklps_avx(auVar108,auVar106);
          auVar127 = vunpcklps_avx(auVar107,auVar121);
          auVar106 = vunpckhps_avx(auVar107,auVar121);
          auVar121 = vunpcklps_avx(*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar102 + 0x10 + lVar87)),
                                   *(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar102 + 0x18 + lVar87)));
          auVar108 = vunpckhps_avx(*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar102 + 0x10 + lVar87)),
                                   *(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar102 + 0x18 + lVar87)));
          auVar122 = vunpcklps_avx(*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar102 + 0x14 + lVar87)),
                                   *(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar102 + 0x1c + lVar87)));
          auVar107 = vunpckhps_avx(*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar102 + 0x14 + lVar87)),
                                   *(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar102 + 0x1c + lVar87)));
          auVar55 = vunpcklps_avx(auVar108,auVar107);
          auVar56 = vunpcklps_avx(auVar121,auVar122);
          auVar107 = vunpckhps_avx(auVar121,auVar122);
          auVar122 = vunpcklps_avx(*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar102 + 0x20 + lVar87)),
                                   *(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar102 + 0x28 + lVar87)));
          auVar108 = vunpckhps_avx(*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar102 + 0x20 + lVar87)),
                                   *(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar102 + 0x28 + lVar87)));
          auVar57 = vunpcklps_avx(*(undefined1 (*) [16])
                                   (pfVar7 + *(uint *)(uVar102 + 0x24 + lVar87)),
                                  *(undefined1 (*) [16])
                                   (pfVar9 + *(uint *)(uVar102 + 0x2c + lVar87)));
          auVar121 = vunpckhps_avx(*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar102 + 0x24 + lVar87)),
                                   *(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar102 + 0x2c + lVar87)));
          auVar58 = vunpcklps_avx(auVar108,auVar121);
          auVar59 = vunpcklps_avx(auVar122,auVar57);
          auVar121 = vunpckhps_avx(auVar122,auVar57);
          auVar57 = vunpcklps_avx(*(undefined1 (*) [16])
                                   (pfVar6 + *(uint *)(uVar102 + 0x30 + lVar87)),
                                  *(undefined1 (*) [16])
                                   (pfVar8 + *(uint *)(uVar102 + 0x38 + lVar87)));
          auVar108 = vunpckhps_avx(*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar102 + 0x30 + lVar87)),
                                   *(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar102 + 0x38 + lVar87)));
          auVar60 = vunpcklps_avx(*(undefined1 (*) [16])
                                   (pfVar7 + *(uint *)(uVar102 + 0x34 + lVar87)),
                                  *(undefined1 (*) [16])
                                   (pfVar9 + *(uint *)(uVar102 + 0x3c + lVar87)));
          auVar122 = vunpckhps_avx(*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar102 + 0x34 + lVar87)),
                                   *(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar102 + 0x3c + lVar87)));
          auVar61 = vunpcklps_avx(auVar108,auVar122);
          auVar62 = vunpcklps_avx(auVar57,auVar60);
          auVar108 = *(undefined1 (*) [16])(uVar102 + 0x40 + lVar87);
          local_b20._16_16_ = auVar108;
          local_b20._0_16_ = auVar108;
          auVar122 = vunpckhps_avx(auVar57,auVar60);
          lVar87 = uVar102 + 0x50 + lVar87;
          local_b40 = *(undefined8 *)(lVar87 + 0x10);
          uStack_b38 = *(undefined8 *)(lVar87 + 0x18);
          uStack_b30 = local_b40;
          uStack_b28 = uStack_b38;
          auVar135._16_16_ = auVar59;
          auVar135._0_16_ = auVar127;
          auVar140._16_16_ = auVar121;
          auVar140._0_16_ = auVar106;
          auVar143._16_16_ = auVar58;
          auVar143._0_16_ = auVar126;
          auVar123._16_16_ = auVar56;
          auVar123._0_16_ = auVar56;
          auVar137._16_16_ = auVar107;
          auVar137._0_16_ = auVar107;
          auVar129._16_16_ = auVar55;
          auVar129._0_16_ = auVar55;
          auVar154._16_16_ = auVar62;
          auVar154._0_16_ = auVar62;
          auVar170._16_16_ = auVar122;
          auVar170._0_16_ = auVar122;
          auVar110._16_16_ = auVar61;
          auVar110._0_16_ = auVar61;
          local_cc0 = vsubps_avx(auVar135,auVar123);
          auVar109 = vsubps_avx(auVar140,auVar137);
          auVar128 = vsubps_avx(auVar143,auVar129);
          auVar112 = vsubps_avx(auVar154,auVar135);
          auVar123 = vsubps_avx(auVar170,auVar140);
          auVar110 = vsubps_avx(auVar110,auVar143);
          fVar117 = auVar109._0_4_;
          fVar178 = auVar110._0_4_;
          fVar146 = auVar109._4_4_;
          fVar179 = auVar110._4_4_;
          auVar53._4_4_ = fVar179 * fVar146;
          auVar53._0_4_ = fVar178 * fVar117;
          fVar18 = auVar109._8_4_;
          fVar180 = auVar110._8_4_;
          auVar53._8_4_ = fVar180 * fVar18;
          fVar25 = auVar109._12_4_;
          fVar181 = auVar110._12_4_;
          auVar53._12_4_ = fVar181 * fVar25;
          fVar32 = auVar109._16_4_;
          fVar182 = auVar110._16_4_;
          auVar53._16_4_ = fVar182 * fVar32;
          fVar39 = auVar109._20_4_;
          fVar183 = auVar110._20_4_;
          auVar53._20_4_ = fVar183 * fVar39;
          fVar46 = auVar109._24_4_;
          fVar184 = auVar110._24_4_;
          auVar53._24_4_ = fVar184 * fVar46;
          auVar53._28_4_ = auVar61._12_4_;
          fVar118 = auVar128._0_4_;
          fVar169 = auVar123._0_4_;
          fVar148 = auVar128._4_4_;
          fVar172 = auVar123._4_4_;
          auVar54._4_4_ = fVar172 * fVar148;
          auVar54._0_4_ = fVar169 * fVar118;
          fVar19 = auVar128._8_4_;
          fVar173 = auVar123._8_4_;
          auVar54._8_4_ = fVar173 * fVar19;
          fVar26 = auVar128._12_4_;
          fVar174 = auVar123._12_4_;
          auVar54._12_4_ = fVar174 * fVar26;
          fVar33 = auVar128._16_4_;
          fVar175 = auVar123._16_4_;
          auVar54._16_4_ = fVar175 * fVar33;
          fVar40 = auVar128._20_4_;
          fVar176 = auVar123._20_4_;
          auVar54._20_4_ = fVar176 * fVar40;
          fVar47 = auVar128._24_4_;
          uVar63 = auVar56._12_4_;
          fVar177 = auVar123._24_4_;
          auVar54._24_4_ = fVar177 * fVar47;
          auVar54._28_4_ = uVar63;
          local_c20 = vsubps_avx(auVar54,auVar53);
          fVar153 = auVar112._0_4_;
          fVar156 = auVar112._4_4_;
          auVar64._4_4_ = fVar156 * fVar148;
          auVar64._0_4_ = fVar153 * fVar118;
          fVar158 = auVar112._8_4_;
          auVar64._8_4_ = fVar158 * fVar19;
          fVar160 = auVar112._12_4_;
          auVar64._12_4_ = fVar160 * fVar26;
          fVar162 = auVar112._16_4_;
          auVar64._16_4_ = fVar162 * fVar33;
          fVar164 = auVar112._20_4_;
          auVar64._20_4_ = fVar164 * fVar40;
          fVar166 = auVar112._24_4_;
          auVar64._24_4_ = fVar166 * fVar47;
          auVar64._28_4_ = uVar63;
          fVar119 = local_cc0._0_4_;
          fVar13 = local_cc0._4_4_;
          auVar66._4_4_ = fVar179 * fVar13;
          auVar66._0_4_ = fVar178 * fVar119;
          fVar20 = local_cc0._8_4_;
          auVar66._8_4_ = fVar180 * fVar20;
          fVar27 = local_cc0._12_4_;
          auVar66._12_4_ = fVar181 * fVar27;
          fVar34 = local_cc0._16_4_;
          auVar66._16_4_ = fVar182 * fVar34;
          fVar41 = local_cc0._20_4_;
          auVar66._20_4_ = fVar183 * fVar41;
          fVar48 = local_cc0._24_4_;
          uVar65 = auVar55._12_4_;
          auVar66._24_4_ = fVar184 * fVar48;
          auVar66._28_4_ = uVar65;
          _local_c40 = vsubps_avx(auVar66,auVar64);
          auVar67._4_4_ = fVar172 * fVar13;
          auVar67._0_4_ = fVar169 * fVar119;
          auVar67._8_4_ = fVar173 * fVar20;
          auVar67._12_4_ = fVar174 * fVar27;
          auVar67._16_4_ = fVar175 * fVar34;
          auVar67._20_4_ = fVar176 * fVar41;
          auVar67._24_4_ = fVar177 * fVar48;
          auVar67._28_4_ = uVar65;
          auVar68._4_4_ = fVar156 * fVar146;
          auVar68._0_4_ = fVar153 * fVar117;
          auVar68._8_4_ = fVar158 * fVar18;
          auVar68._12_4_ = fVar160 * fVar25;
          auVar68._16_4_ = fVar162 * fVar32;
          auVar68._20_4_ = fVar164 * fVar39;
          auVar68._24_4_ = fVar166 * fVar46;
          auVar68._28_4_ = auVar108._12_4_;
          uVar1 = *(undefined4 *)(ray + k * 4);
          auVar185._4_4_ = uVar1;
          auVar185._0_4_ = uVar1;
          auVar185._8_4_ = uVar1;
          auVar185._12_4_ = uVar1;
          auVar185._16_4_ = uVar1;
          auVar185._20_4_ = uVar1;
          auVar185._24_4_ = uVar1;
          auVar185._28_4_ = uVar1;
          uVar3 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar186._4_4_ = uVar3;
          auVar186._0_4_ = uVar3;
          auVar186._8_4_ = uVar3;
          auVar186._12_4_ = uVar3;
          auVar186._16_4_ = uVar3;
          auVar186._20_4_ = uVar3;
          auVar186._24_4_ = uVar3;
          auVar186._28_4_ = uVar3;
          uVar4 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar187._4_4_ = uVar4;
          auVar187._0_4_ = uVar4;
          auVar187._8_4_ = uVar4;
          auVar187._12_4_ = uVar4;
          auVar187._16_4_ = uVar4;
          auVar187._20_4_ = uVar4;
          auVar187._24_4_ = uVar4;
          auVar187._28_4_ = uVar4;
          fVar105 = *(float *)(ray + k * 4 + 0xa0);
          local_c60 = vsubps_avx(auVar68,auVar67);
          auVar109 = vsubps_avx(auVar135,auVar185);
          fVar115 = *(float *)(ray + k * 4 + 0xc0);
          auVar128 = vsubps_avx(auVar140,auVar186);
          auVar53 = vsubps_avx(auVar143,auVar187);
          fVar142 = auVar53._0_4_;
          fVar145 = auVar53._4_4_;
          auVar69._4_4_ = fVar145 * fVar105;
          auVar69._0_4_ = fVar142 * fVar105;
          fVar147 = auVar53._8_4_;
          auVar69._8_4_ = fVar147 * fVar105;
          fVar149 = auVar53._12_4_;
          auVar69._12_4_ = fVar149 * fVar105;
          fVar150 = auVar53._16_4_;
          auVar69._16_4_ = fVar150 * fVar105;
          fVar151 = auVar53._20_4_;
          auVar69._20_4_ = fVar151 * fVar105;
          fVar152 = auVar53._24_4_;
          auVar69._24_4_ = fVar152 * fVar105;
          auVar69._28_4_ = uVar1;
          fVar120 = auVar128._0_4_;
          fVar14 = auVar128._4_4_;
          auVar70._4_4_ = fVar115 * fVar14;
          auVar70._0_4_ = fVar115 * fVar120;
          fVar21 = auVar128._8_4_;
          auVar70._8_4_ = fVar115 * fVar21;
          fVar28 = auVar128._12_4_;
          auVar70._12_4_ = fVar115 * fVar28;
          fVar35 = auVar128._16_4_;
          auVar70._16_4_ = fVar115 * fVar35;
          fVar42 = auVar128._20_4_;
          auVar70._20_4_ = fVar115 * fVar42;
          fVar49 = auVar128._24_4_;
          auVar70._24_4_ = fVar115 * fVar49;
          auVar70._28_4_ = uVar3;
          auVar128 = vsubps_avx(auVar70,auVar69);
          fVar116 = *(float *)(ray + k * 4 + 0x80);
          fVar139 = auVar109._0_4_;
          fVar15 = auVar109._4_4_;
          auVar71._4_4_ = fVar115 * fVar15;
          auVar71._0_4_ = fVar115 * fVar139;
          fVar22 = auVar109._8_4_;
          auVar71._8_4_ = fVar115 * fVar22;
          fVar29 = auVar109._12_4_;
          auVar71._12_4_ = fVar115 * fVar29;
          fVar36 = auVar109._16_4_;
          auVar71._16_4_ = fVar115 * fVar36;
          fVar43 = auVar109._20_4_;
          auVar71._20_4_ = fVar115 * fVar43;
          fVar50 = auVar109._24_4_;
          auVar71._24_4_ = fVar115 * fVar50;
          auVar71._28_4_ = uVar4;
          auVar72._4_4_ = fVar145 * fVar116;
          auVar72._0_4_ = fVar142 * fVar116;
          auVar72._8_4_ = fVar147 * fVar116;
          auVar72._12_4_ = fVar149 * fVar116;
          auVar72._16_4_ = fVar150 * fVar116;
          auVar72._20_4_ = fVar151 * fVar116;
          auVar72._24_4_ = fVar152 * fVar116;
          auVar72._28_4_ = uVar63;
          auVar53 = vsubps_avx(auVar72,auVar71);
          auVar73._4_4_ = fVar116 * fVar14;
          auVar73._0_4_ = fVar116 * fVar120;
          auVar73._8_4_ = fVar116 * fVar21;
          auVar73._12_4_ = fVar116 * fVar28;
          auVar73._16_4_ = fVar116 * fVar35;
          auVar73._20_4_ = fVar116 * fVar42;
          auVar73._24_4_ = fVar116 * fVar49;
          auVar73._28_4_ = uVar4;
          auVar74._4_4_ = fVar15 * fVar105;
          auVar74._0_4_ = fVar139 * fVar105;
          auVar74._8_4_ = fVar22 * fVar105;
          auVar74._12_4_ = fVar29 * fVar105;
          auVar74._16_4_ = fVar36 * fVar105;
          auVar74._20_4_ = fVar43 * fVar105;
          auVar74._24_4_ = fVar50 * fVar105;
          auVar74._28_4_ = uVar65;
          auVar54 = vsubps_avx(auVar74,auVar73);
          fVar141 = local_c60._0_4_;
          fVar16 = local_c60._4_4_;
          fVar23 = local_c60._8_4_;
          fVar30 = local_c60._12_4_;
          fVar37 = local_c60._16_4_;
          fVar44 = local_c60._20_4_;
          fVar51 = local_c60._24_4_;
          fVar144 = local_c20._0_4_;
          fVar17 = local_c20._4_4_;
          fVar24 = local_c20._8_4_;
          fVar31 = local_c20._12_4_;
          fVar38 = local_c20._16_4_;
          fVar45 = local_c20._20_4_;
          fVar52 = local_c20._24_4_;
          auVar111._0_4_ = fVar116 * fVar144 + fVar115 * fVar141 + (float)local_c40._0_4_ * fVar105;
          auVar111._4_4_ = fVar116 * fVar17 + fVar115 * fVar16 + (float)local_c40._4_4_ * fVar105;
          auVar111._8_4_ = fVar116 * fVar24 + fVar115 * fVar23 + fStack_c38 * fVar105;
          auVar111._12_4_ = fVar116 * fVar31 + fVar115 * fVar30 + fStack_c34 * fVar105;
          auVar111._16_4_ = fVar116 * fVar38 + fVar115 * fVar37 + fStack_c30 * fVar105;
          auVar111._20_4_ = fVar116 * fVar45 + fVar115 * fVar44 + fStack_c2c * fVar105;
          auVar111._24_4_ = fVar116 * fVar52 + fVar115 * fVar51 + fStack_c28 * fVar105;
          auVar111._28_4_ = fVar115 + fVar115 + fVar105;
          auVar130._8_4_ = 0x80000000;
          auVar130._0_8_ = 0x8000000080000000;
          auVar130._12_4_ = 0x80000000;
          auVar130._16_4_ = 0x80000000;
          auVar130._20_4_ = 0x80000000;
          auVar130._24_4_ = 0x80000000;
          auVar130._28_4_ = 0x80000000;
          auVar109 = vandps_avx(auVar111,auVar130);
          uVar90 = auVar109._0_4_;
          local_b00._0_4_ =
               (float)(uVar90 ^ (uint)(fVar153 * auVar128._0_4_ +
                                      fVar178 * auVar54._0_4_ + fVar169 * auVar53._0_4_));
          uVar157 = auVar109._4_4_;
          local_b00._4_4_ =
               (float)(uVar157 ^
                      (uint)(fVar156 * auVar128._4_4_ +
                            fVar179 * auVar54._4_4_ + fVar172 * auVar53._4_4_));
          uVar159 = auVar109._8_4_;
          local_b00._8_4_ =
               (float)(uVar159 ^
                      (uint)(fVar158 * auVar128._8_4_ +
                            fVar180 * auVar54._8_4_ + fVar173 * auVar53._8_4_));
          uVar161 = auVar109._12_4_;
          local_b00._12_4_ =
               (float)(uVar161 ^
                      (uint)(fVar160 * auVar128._12_4_ +
                            fVar181 * auVar54._12_4_ + fVar174 * auVar53._12_4_));
          uVar163 = auVar109._16_4_;
          local_b00._16_4_ =
               (float)(uVar163 ^
                      (uint)(fVar162 * auVar128._16_4_ +
                            fVar182 * auVar54._16_4_ + fVar175 * auVar53._16_4_));
          uVar165 = auVar109._20_4_;
          local_b00._20_4_ =
               (float)(uVar165 ^
                      (uint)(fVar164 * auVar128._20_4_ +
                            fVar183 * auVar54._20_4_ + fVar176 * auVar53._20_4_));
          uVar167 = auVar109._24_4_;
          local_b00._24_4_ =
               (float)(uVar167 ^
                      (uint)(fVar166 * auVar128._24_4_ +
                            fVar184 * auVar54._24_4_ + fVar177 * auVar53._24_4_));
          uVar168 = auVar109._28_4_;
          local_b00._28_4_ =
               (float)(uVar168 ^ (uint)(auVar112._28_4_ + auVar110._28_4_ + auVar123._28_4_));
          local_ae0._0_4_ =
               (float)(uVar90 ^ (uint)(auVar128._0_4_ * fVar119 +
                                      fVar118 * auVar54._0_4_ + fVar117 * auVar53._0_4_));
          local_ae0._4_4_ =
               (float)(uVar157 ^
                      (uint)(auVar128._4_4_ * fVar13 +
                            fVar148 * auVar54._4_4_ + fVar146 * auVar53._4_4_));
          local_ae0._8_4_ =
               (float)(uVar159 ^
                      (uint)(auVar128._8_4_ * fVar20 +
                            fVar19 * auVar54._8_4_ + fVar18 * auVar53._8_4_));
          local_ae0._12_4_ =
               (float)(uVar161 ^
                      (uint)(auVar128._12_4_ * fVar27 +
                            fVar26 * auVar54._12_4_ + fVar25 * auVar53._12_4_));
          local_ae0._16_4_ =
               (float)(uVar163 ^
                      (uint)(auVar128._16_4_ * fVar34 +
                            fVar33 * auVar54._16_4_ + fVar32 * auVar53._16_4_));
          local_ae0._20_4_ =
               (float)(uVar165 ^
                      (uint)(auVar128._20_4_ * fVar41 +
                            fVar40 * auVar54._20_4_ + fVar39 * auVar53._20_4_));
          local_ae0._24_4_ =
               (float)(uVar167 ^
                      (uint)(auVar128._24_4_ * fVar48 +
                            fVar47 * auVar54._24_4_ + fVar46 * auVar53._24_4_));
          local_ae0._28_4_ = (float)(uVar168 ^ (uint)(auVar54._28_4_ + auVar53._28_4_ + -0.0));
          auVar128 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar109 = vcmpps_avx(local_b00,auVar128,5);
          auVar128 = vcmpps_avx(local_ae0,auVar128,5);
          auVar109 = vandps_avx(auVar109,auVar128);
          auVar131._8_4_ = 0x7fffffff;
          auVar131._0_8_ = 0x7fffffff7fffffff;
          auVar131._12_4_ = 0x7fffffff;
          auVar131._16_4_ = 0x7fffffff;
          auVar131._20_4_ = 0x7fffffff;
          auVar131._24_4_ = 0x7fffffff;
          auVar131._28_4_ = 0x7fffffff;
          local_aa0 = vandps_avx(auVar111,auVar131);
          auVar128 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar111,4);
          auVar109 = vandps_avx(auVar109,auVar128);
          auVar112._0_4_ = local_b00._0_4_ + local_ae0._0_4_;
          auVar112._4_4_ = local_b00._4_4_ + local_ae0._4_4_;
          auVar112._8_4_ = local_b00._8_4_ + local_ae0._8_4_;
          auVar112._12_4_ = local_b00._12_4_ + local_ae0._12_4_;
          auVar112._16_4_ = local_b00._16_4_ + local_ae0._16_4_;
          auVar112._20_4_ = local_b00._20_4_ + local_ae0._20_4_;
          auVar112._24_4_ = local_b00._24_4_ + local_ae0._24_4_;
          auVar112._28_4_ = local_b00._28_4_ + local_ae0._28_4_;
          auVar128 = vcmpps_avx(auVar112,local_aa0,2);
          auVar112 = auVar128 & auVar109;
          if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar112 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar112 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar112 >> 0x7f,0) != '\0') ||
                (auVar112 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar112 >> 0xbf,0) != '\0') ||
              (auVar112 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar112[0x1f] < '\0') {
            auVar109 = vandps_avx(auVar109,auVar128);
            auVar108 = vpackssdw_avx(auVar109._0_16_,auVar109._16_16_);
            local_ac0._0_4_ =
                 (float)(uVar90 ^ (uint)(fVar144 * fVar139 +
                                        (float)local_c40._0_4_ * fVar120 + fVar142 * fVar141));
            local_ac0._4_4_ =
                 (float)(uVar157 ^
                        (uint)(fVar17 * fVar15 + (float)local_c40._4_4_ * fVar14 + fVar145 * fVar16)
                        );
            local_ac0._8_4_ =
                 (float)(uVar159 ^ (uint)(fVar24 * fVar22 + fStack_c38 * fVar21 + fVar147 * fVar23))
            ;
            local_ac0._12_4_ =
                 (float)(uVar161 ^ (uint)(fVar31 * fVar29 + fStack_c34 * fVar28 + fVar149 * fVar30))
            ;
            local_ac0._16_4_ =
                 (float)(uVar163 ^ (uint)(fVar38 * fVar36 + fStack_c30 * fVar35 + fVar150 * fVar37))
            ;
            local_ac0._20_4_ =
                 (float)(uVar165 ^ (uint)(fVar45 * fVar43 + fStack_c2c * fVar42 + fVar151 * fVar44))
            ;
            local_ac0._24_4_ =
                 (float)(uVar167 ^ (uint)(fVar52 * fVar50 + fStack_c28 * fVar49 + fVar152 * fVar51))
            ;
            local_ac0._28_4_ = uVar168 ^ 0x7fc00000;
            fVar105 = *(float *)(ray + k * 4 + 0x60);
            fVar115 = local_aa0._0_4_;
            fVar116 = local_aa0._4_4_;
            auVar75._4_4_ = fVar116 * fVar105;
            auVar75._0_4_ = fVar115 * fVar105;
            fVar117 = local_aa0._8_4_;
            auVar75._8_4_ = fVar117 * fVar105;
            fVar118 = local_aa0._12_4_;
            auVar75._12_4_ = fVar118 * fVar105;
            fVar119 = local_aa0._16_4_;
            auVar75._16_4_ = fVar119 * fVar105;
            fVar120 = local_aa0._20_4_;
            auVar75._20_4_ = fVar120 * fVar105;
            fVar139 = local_aa0._24_4_;
            auVar75._24_4_ = fVar139 * fVar105;
            auVar75._28_4_ = fVar105;
            auVar109 = vcmpps_avx(auVar75,local_ac0,1);
            fVar105 = *(float *)(ray + k * 4 + 0x100);
            auVar76._4_4_ = fVar116 * fVar105;
            auVar76._0_4_ = fVar115 * fVar105;
            auVar76._8_4_ = fVar117 * fVar105;
            auVar76._12_4_ = fVar118 * fVar105;
            auVar76._16_4_ = fVar119 * fVar105;
            auVar76._20_4_ = fVar120 * fVar105;
            auVar76._24_4_ = fVar139 * fVar105;
            auVar76._28_4_ = fVar105;
            auVar128 = vcmpps_avx(local_ac0,auVar76,2);
            auVar109 = vandps_avx(auVar109,auVar128);
            auVar106 = vpackssdw_avx(auVar109._0_16_,auVar109._16_16_);
            auVar108 = vpand_avx(auVar106,auVar108);
            auVar106 = vpmovzxwd_avx(auVar108);
            auVar106 = vpslld_avx(auVar106,0x1f);
            auVar107 = vpsrad_avx(auVar106,0x1f);
            auVar106 = vpunpckhwd_avx(auVar108,auVar108);
            auVar106 = vpslld_avx(auVar106,0x1f);
            auVar106 = vpsrad_avx(auVar106,0x1f);
            local_a20._16_16_ = auVar106;
            local_a20._0_16_ = auVar107;
            if ((((((((local_a20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (local_a20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_a20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_a20 >> 0x7f,0) != '\0') ||
                  (local_a20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB161(auVar106 >> 0x3f,0) != '\0') ||
                (local_a20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar106[0xf] < '\0') {
              local_a80 = local_c20;
              local_a60 = (float)local_c40._0_4_;
              fStack_a5c = (float)local_c40._4_4_;
              fStack_a58 = fStack_c38;
              fStack_a54 = fStack_c34;
              fStack_a50 = fStack_c30;
              fStack_a4c = fStack_c2c;
              fStack_a48 = fStack_c28;
              uStack_a44 = uStack_c24;
              local_a40 = local_c60;
              local_940 = local_b60;
              auVar128 = vrcpps_avx(local_aa0);
              fVar105 = auVar128._0_4_;
              auVar124._0_4_ = fVar115 * fVar105;
              fVar115 = auVar128._4_4_;
              auVar124._4_4_ = fVar116 * fVar115;
              fVar116 = auVar128._8_4_;
              auVar124._8_4_ = fVar117 * fVar116;
              fVar117 = auVar128._12_4_;
              auVar124._12_4_ = fVar118 * fVar117;
              fVar118 = auVar128._16_4_;
              auVar124._16_4_ = fVar119 * fVar118;
              fVar119 = auVar128._20_4_;
              auVar124._20_4_ = fVar120 * fVar119;
              fVar120 = auVar128._24_4_;
              auVar124._24_4_ = fVar139 * fVar120;
              auVar124._28_4_ = 0;
              auVar138._8_4_ = 0x3f800000;
              auVar138._0_8_ = &DAT_3f8000003f800000;
              auVar138._12_4_ = 0x3f800000;
              auVar138._16_4_ = 0x3f800000;
              auVar138._20_4_ = 0x3f800000;
              auVar138._24_4_ = 0x3f800000;
              auVar138._28_4_ = 0x3f800000;
              auVar109 = vsubps_avx(auVar138,auVar124);
              fStack_9a4 = auVar109._28_4_;
              fVar105 = fVar105 + fVar105 * auVar109._0_4_;
              fVar115 = fVar115 + fVar115 * auVar109._4_4_;
              fVar116 = fVar116 + fVar116 * auVar109._8_4_;
              fVar117 = fVar117 + fVar117 * auVar109._12_4_;
              fVar118 = fVar118 + fVar118 * auVar109._16_4_;
              fVar119 = fVar119 + fVar119 * auVar109._20_4_;
              fVar120 = fVar120 + fVar120 * auVar109._24_4_;
              local_9c0[0] = fVar105 * local_ac0._0_4_;
              local_9c0[1] = fVar115 * local_ac0._4_4_;
              local_9c0[2] = fVar116 * local_ac0._8_4_;
              local_9c0[3] = fVar117 * local_ac0._12_4_;
              fStack_9b0 = fVar118 * local_ac0._16_4_;
              fStack_9ac = fVar119 * local_ac0._20_4_;
              fStack_9a8 = fVar120 * local_ac0._24_4_;
              auVar77._4_4_ = fVar115 * local_b00._4_4_;
              auVar77._0_4_ = fVar105 * local_b00._0_4_;
              auVar77._8_4_ = fVar116 * local_b00._8_4_;
              auVar77._12_4_ = fVar117 * local_b00._12_4_;
              auVar77._16_4_ = fVar118 * local_b00._16_4_;
              auVar77._20_4_ = fVar119 * local_b00._20_4_;
              auVar77._24_4_ = fVar120 * local_b00._24_4_;
              auVar77._28_4_ = fStack_9a4;
              auVar109 = vminps_avx(auVar77,auVar138);
              auVar78._4_4_ = fVar115 * local_ae0._4_4_;
              auVar78._0_4_ = fVar105 * local_ae0._0_4_;
              auVar78._8_4_ = fVar116 * local_ae0._8_4_;
              auVar78._12_4_ = fVar117 * local_ae0._12_4_;
              auVar78._16_4_ = fVar118 * local_ae0._16_4_;
              auVar78._20_4_ = fVar119 * local_ae0._20_4_;
              auVar78._24_4_ = fVar120 * local_ae0._24_4_;
              auVar78._28_4_ = auVar128._28_4_ + fStack_9a4;
              auVar128 = vminps_avx(auVar78,auVar138);
              auVar112 = vsubps_avx(auVar138,auVar109);
              auVar123 = vsubps_avx(auVar138,auVar128);
              local_9e0 = vblendvps_avx(auVar128,auVar112,local_b60);
              local_a00 = vblendvps_avx(auVar109,auVar123,local_b60);
              local_980._4_4_ = (float)local_c40._4_4_ * (float)local_b80._4_4_;
              local_980._0_4_ = (float)local_c40._0_4_ * (float)local_b80._0_4_;
              local_980._8_4_ = fStack_c38 * fStack_b78;
              local_980._12_4_ = fStack_c34 * fStack_b74;
              local_980._16_4_ = fStack_c30 * fStack_b70;
              local_980._20_4_ = fStack_c2c * fStack_b6c;
              local_980._24_4_ = fStack_c28 * fStack_b68;
              local_980._28_4_ = local_a00._28_4_;
              local_960._4_4_ = fVar16 * (float)local_b80._4_4_;
              local_960._0_4_ = fVar141 * (float)local_b80._0_4_;
              local_960._8_4_ = fVar23 * fStack_b78;
              local_960._12_4_ = fVar30 * fStack_b74;
              local_960._16_4_ = fVar37 * fStack_b70;
              local_960._20_4_ = fVar44 * fStack_b6c;
              local_960._24_4_ = fVar51 * fStack_b68;
              local_960._28_4_ = uStack_b64;
              local_9a0[0] = fVar144 * (float)local_b80._0_4_;
              local_9a0[1] = fVar17 * (float)local_b80._4_4_;
              local_9a0[2] = fVar24 * fStack_b78;
              local_9a0[3] = fVar31 * fStack_b74;
              fStack_990 = fVar38 * fStack_b70;
              fStack_98c = fVar45 * fStack_b6c;
              fStack_988 = fVar52 * fStack_b68;
              uStack_984 = local_9e0._28_4_;
              auVar108 = vpsllw_avx(auVar108,0xf);
              auVar108 = vpacksswb_avx(auVar108,auVar108);
              uVar91 = (ulong)(byte)(SUB161(auVar108 >> 7,0) & 1 |
                                     (SUB161(auVar108 >> 0xf,0) & 1) << 1 |
                                     (SUB161(auVar108 >> 0x17,0) & 1) << 2 |
                                     (SUB161(auVar108 >> 0x1f,0) & 1) << 3 |
                                     (SUB161(auVar108 >> 0x27,0) & 1) << 4 |
                                     (SUB161(auVar108 >> 0x2f,0) & 1) << 5 |
                                     (SUB161(auVar108 >> 0x37,0) & 1) << 6 |
                                    SUB161(auVar108 >> 0x3f,0) << 7);
              do {
                uVar12 = 0;
                if (uVar91 != 0) {
                  for (; (uVar91 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                  }
                }
                uVar90 = *(uint *)(local_b20 + uVar12 * 4);
                pGVar10 = (pSVar97->geometries).items[uVar90].ptr;
                if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  uVar91 = uVar91 ^ 1L << (uVar12 & 0x3f);
                  bVar104 = true;
                }
                else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                        (pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  bVar104 = false;
                }
                else {
                  local_cc0._0_8_ = uVar91;
                  local_c60._0_8_ = pSVar97;
                  local_c40 = auVar99;
                  local_c20._0_8_ = uVar98;
                  uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
                  uVar3 = *(undefined4 *)(local_a00 + uVar12 * 4);
                  local_8c0._4_4_ = uVar3;
                  local_8c0._0_4_ = uVar3;
                  local_8c0._8_4_ = uVar3;
                  local_8c0._12_4_ = uVar3;
                  local_8c0._16_4_ = uVar3;
                  local_8c0._20_4_ = uVar3;
                  local_8c0._24_4_ = uVar3;
                  local_8c0._28_4_ = uVar3;
                  fVar105 = local_9c0[uVar12 - 8];
                  local_8a0._4_4_ = fVar105;
                  local_8a0._0_4_ = fVar105;
                  local_8a0._8_4_ = fVar105;
                  local_8a0._12_4_ = fVar105;
                  local_8a0._16_4_ = fVar105;
                  local_8a0._20_4_ = fVar105;
                  local_8a0._24_4_ = fVar105;
                  local_8a0._28_4_ = fVar105;
                  *(float *)(ray + k * 4 + 0x100) = local_9c0[uVar12];
                  local_c90.context = context->user;
                  uVar3 = *(undefined4 *)((long)&local_b40 + uVar12 * 4);
                  local_880._4_4_ = uVar3;
                  local_880._0_4_ = uVar3;
                  local_880._8_4_ = uVar3;
                  local_880._12_4_ = uVar3;
                  local_880._16_4_ = uVar3;
                  local_880._20_4_ = uVar3;
                  local_880._24_4_ = uVar3;
                  local_880._28_4_ = uVar3;
                  fVar105 = local_9a0[uVar12];
                  uVar3 = *(undefined4 *)(local_980 + uVar12 * 4);
                  local_900._4_4_ = uVar3;
                  local_900._0_4_ = uVar3;
                  local_900._8_4_ = uVar3;
                  local_900._12_4_ = uVar3;
                  local_900._16_4_ = uVar3;
                  local_900._20_4_ = uVar3;
                  local_900._24_4_ = uVar3;
                  local_900._28_4_ = uVar3;
                  local_850 = vpshufd_avx(ZEXT416(uVar90),0);
                  uVar3 = *(undefined4 *)(local_960 + uVar12 * 4);
                  local_8e0._4_4_ = uVar3;
                  local_8e0._0_4_ = uVar3;
                  local_8e0._8_4_ = uVar3;
                  local_8e0._12_4_ = uVar3;
                  local_8e0._16_4_ = uVar3;
                  local_8e0._20_4_ = uVar3;
                  local_8e0._24_4_ = uVar3;
                  local_8e0._28_4_ = uVar3;
                  local_920[0] = (RTCHitN)SUB41(fVar105,0);
                  local_920[1] = (RTCHitN)(char)((uint)fVar105 >> 8);
                  local_920[2] = (RTCHitN)(char)((uint)fVar105 >> 0x10);
                  local_920[3] = (RTCHitN)(char)((uint)fVar105 >> 0x18);
                  local_920[4] = (RTCHitN)SUB41(fVar105,0);
                  local_920[5] = (RTCHitN)(char)((uint)fVar105 >> 8);
                  local_920[6] = (RTCHitN)(char)((uint)fVar105 >> 0x10);
                  local_920[7] = (RTCHitN)(char)((uint)fVar105 >> 0x18);
                  local_920[8] = (RTCHitN)SUB41(fVar105,0);
                  local_920[9] = (RTCHitN)(char)((uint)fVar105 >> 8);
                  local_920[10] = (RTCHitN)(char)((uint)fVar105 >> 0x10);
                  local_920[0xb] = (RTCHitN)(char)((uint)fVar105 >> 0x18);
                  local_920[0xc] = (RTCHitN)SUB41(fVar105,0);
                  local_920[0xd] = (RTCHitN)(char)((uint)fVar105 >> 8);
                  local_920[0xe] = (RTCHitN)(char)((uint)fVar105 >> 0x10);
                  local_920[0xf] = (RTCHitN)(char)((uint)fVar105 >> 0x18);
                  local_920[0x10] = (RTCHitN)SUB41(fVar105,0);
                  local_920[0x11] = (RTCHitN)(char)((uint)fVar105 >> 8);
                  local_920[0x12] = (RTCHitN)(char)((uint)fVar105 >> 0x10);
                  local_920[0x13] = (RTCHitN)(char)((uint)fVar105 >> 0x18);
                  local_920[0x14] = (RTCHitN)SUB41(fVar105,0);
                  local_920[0x15] = (RTCHitN)(char)((uint)fVar105 >> 8);
                  local_920[0x16] = (RTCHitN)(char)((uint)fVar105 >> 0x10);
                  local_920[0x17] = (RTCHitN)(char)((uint)fVar105 >> 0x18);
                  local_920[0x18] = (RTCHitN)SUB41(fVar105,0);
                  local_920[0x19] = (RTCHitN)(char)((uint)fVar105 >> 8);
                  local_920[0x1a] = (RTCHitN)(char)((uint)fVar105 >> 0x10);
                  local_920[0x1b] = (RTCHitN)(char)((uint)fVar105 >> 0x18);
                  local_920[0x1c] = (RTCHitN)SUB41(fVar105,0);
                  local_920[0x1d] = (RTCHitN)(char)((uint)fVar105 >> 8);
                  local_920[0x1e] = (RTCHitN)(char)((uint)fVar105 >> 0x10);
                  local_920[0x1f] = (RTCHitN)(char)((uint)fVar105 >> 0x18);
                  local_860 = local_850;
                  vcmpps_avx(local_8c0,local_8c0,0xf);
                  uStack_83c = (local_c90.context)->instID[0];
                  local_840 = uStack_83c;
                  uStack_838 = uStack_83c;
                  uStack_834 = uStack_83c;
                  uStack_830 = uStack_83c;
                  uStack_82c = uStack_83c;
                  uStack_828 = uStack_83c;
                  uStack_824 = uStack_83c;
                  uStack_81c = (local_c90.context)->instPrimID[0];
                  local_820 = uStack_81c;
                  uStack_818 = uStack_81c;
                  uStack_814 = uStack_81c;
                  uStack_810 = uStack_81c;
                  uStack_80c = uStack_81c;
                  uStack_808 = uStack_81c;
                  uStack_804 = uStack_81c;
                  local_ce0 = *(undefined8 *)(mm_lookupmask_ps + uVar88);
                  uStack_cd8 = *(undefined8 *)(mm_lookupmask_ps + uVar88 + 8);
                  local_cd0 = *(undefined8 *)(mm_lookupmask_ps + lVar89);
                  uStack_cc8 = *(undefined8 *)(mm_lookupmask_ps + lVar89 + 8);
                  local_c90.valid = (int *)&local_ce0;
                  local_c90.geometryUserPtr = pGVar10->userPtr;
                  local_c90.hit = local_920;
                  local_c90.N = 8;
                  local_c90.ray = (RTCRayN *)ray;
                  if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar10->occlusionFilterN)(&local_c90);
                  }
                  auVar108._8_8_ = uStack_cd8;
                  auVar108._0_8_ = local_ce0;
                  auVar108 = vpcmpeqd_avx((undefined1  [16])0x0,auVar108);
                  auVar55._8_8_ = uStack_cc8;
                  auVar55._0_8_ = local_cd0;
                  auVar106 = vpcmpeqd_avx((undefined1  [16])0x0,auVar55);
                  auVar113._16_16_ = auVar106;
                  auVar113._0_16_ = auVar108;
                  auVar109 = _DAT_0205a980 & ~auVar113;
                  if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar109 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar109 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar109 >> 0x7f,0) == '\0') &&
                        (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar109 >> 0xbf,0) == '\0') &&
                      (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar109[0x1f]) {
                    auVar114._0_8_ = auVar108._0_8_ ^ 0xffffffffffffffff;
                    auVar114._8_4_ = auVar108._8_4_ ^ 0xffffffff;
                    auVar114._12_4_ = auVar108._12_4_ ^ 0xffffffff;
                    auVar114._16_4_ = auVar106._0_4_ ^ 0xffffffff;
                    auVar114._20_4_ = auVar106._4_4_ ^ 0xffffffff;
                    auVar114._24_4_ = auVar106._8_4_ ^ 0xffffffff;
                    auVar114._28_4_ = auVar106._12_4_ ^ 0xffffffff;
                  }
                  else {
                    p_Var11 = context->args->filter;
                    if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var11)(&local_c90);
                    }
                    auVar56._8_8_ = uStack_cd8;
                    auVar56._0_8_ = local_ce0;
                    auVar108 = vpcmpeqd_avx((undefined1  [16])0x0,auVar56);
                    auVar57._8_8_ = uStack_cc8;
                    auVar57._0_8_ = local_cd0;
                    auVar106 = vpcmpeqd_avx((undefined1  [16])0x0,auVar57);
                    auVar125._16_16_ = auVar106;
                    auVar125._0_16_ = auVar108;
                    auVar114._0_8_ = auVar108._0_8_ ^ 0xffffffffffffffff;
                    auVar114._8_4_ = auVar108._8_4_ ^ 0xffffffff;
                    auVar114._12_4_ = auVar108._12_4_ ^ 0xffffffff;
                    auVar114._16_4_ = auVar106._0_4_ ^ 0xffffffff;
                    auVar114._20_4_ = auVar106._4_4_ ^ 0xffffffff;
                    auVar114._24_4_ = auVar106._8_4_ ^ 0xffffffff;
                    auVar114._28_4_ = auVar106._12_4_ ^ 0xffffffff;
                    auVar132._8_4_ = 0xff800000;
                    auVar132._0_8_ = 0xff800000ff800000;
                    auVar132._12_4_ = 0xff800000;
                    auVar132._16_4_ = 0xff800000;
                    auVar132._20_4_ = 0xff800000;
                    auVar132._24_4_ = 0xff800000;
                    auVar132._28_4_ = 0xff800000;
                    auVar109 = vblendvps_avx(auVar132,*(undefined1 (*) [32])(local_c90.ray + 0x100),
                                             auVar125);
                    *(undefined1 (*) [32])(local_c90.ray + 0x100) = auVar109;
                  }
                  bVar85 = (auVar114 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                  bVar86 = (auVar114 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                  bVar84 = (auVar114 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                  bVar83 = SUB321(auVar114 >> 0x7f,0) == '\0';
                  bVar82 = (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
                  bVar81 = SUB321(auVar114 >> 0xbf,0) == '\0';
                  bVar80 = (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
                  bVar79 = -1 < auVar114[0x1f];
                  bVar104 = ((((((bVar85 && bVar86) && bVar84) && bVar83) && bVar82) && bVar81) &&
                            bVar80) && bVar79;
                  if (((((((bVar85 && bVar86) && bVar84) && bVar83) && bVar82) && bVar81) && bVar80)
                      && bVar79) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar1;
                    local_cc0._0_8_ = local_cc0._0_8_ ^ 1L << (uVar12 & 0x3f);
                  }
                  uVar91 = local_cc0._0_8_;
                  pSVar97 = (Scene *)local_c60._0_8_;
                  uVar98 = local_c20._0_8_;
                  auVar99 = local_c40;
                }
              } while ((bVar104) && (uVar91 != 0));
              if (!bVar104) break;
            }
          }
          uVar101 = uVar101 + 1;
          bVar103 = uVar101 < uVar93;
        } while (uVar101 != uVar93);
      }
      uVar90 = 0;
      auVar133 = ZEXT1664(local_b90);
      auVar134 = ZEXT1664(local_ba0);
      auVar136 = ZEXT1664(local_bb0);
      auVar155 = ZEXT1664(local_bf0);
      auVar171 = ZEXT1664(local_c00);
      fVar105 = local_bc0;
      fVar117 = fStack_bbc;
      fVar118 = fStack_bb8;
      fVar119 = fStack_bb4;
      fVar115 = local_bd0;
      fVar120 = fStack_bcc;
      fVar139 = fStack_bc8;
      fVar141 = fStack_bc4;
      fVar116 = local_be0;
      fVar144 = fStack_bdc;
      fVar146 = fStack_bd8;
      fVar148 = fStack_bd4;
      if (bVar103) {
        *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
        uVar90 = 1;
      }
    }
  } while ((uVar90 & 3) == 0);
  return puVar95 != &local_800;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }